

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::~QTextStream(QTextStream *this)

{
  bool bVar1;
  QTextStreamPrivate *this_00;
  QTextStreamPrivate *unaff_retaddr;
  QTextStreamPrivate *d;
  
  this_00 = d_func((QTextStream *)0x13f5bb);
  bVar1 = QString::isEmpty((QString *)0x13f5d1);
  if (!bVar1) {
    QTextStreamPrivate::flushWriteBuffer(unaff_retaddr);
  }
  std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::~unique_ptr
            ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)this_00);
  return;
}

Assistant:

QTextStream::~QTextStream()
{
    Q_D(QTextStream);
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::~QTextStream()");
#endif
    if (!d->writeBuffer.isEmpty())
        d->flushWriteBuffer();
}